

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RBJ.h
# Opt level: O0

void __thiscall Iir::RBJ::HighPass::HighPass(HighPass *this)

{
  RBJbase::RBJbase(&this->super_RBJbase);
  return;
}

Assistant:

struct IIR_EXPORT HighPass : RBJbase
	{
		/**
                 * Calculates the coefficients
                 * \param cutoffFrequency Normalised cutoff frequency (0..1/2)
                 * \param q Q factor determines the resonance peak at the cutoff.
                 **/
		void setupN(double cutoffFrequency,
			    double q = ONESQRT2);
		/**
                 * Calculates the coefficients
                 * \param sampleRate Sampling rate
                 * \param cutoffFrequency Cutoff frequency
                 * \param q Q factor determines the resonance peak at the cutoff.
                 **/
		void setup (double sampleRate,
			    double cutoffFrequency,
			    double q = ONESQRT2) {
			setupN(cutoffFrequency / sampleRate, q);
		}
	}